

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O2

int do_gotoeop(int f,int n,int *i)

{
  byte *pbVar1;
  line *plVar2;
  line *plVar3;
  uint uVar4;
  buffer *pbVar5;
  mgwin *pmVar6;
  bool bVar7;
  ushort **ppuVar8;
  int iVar9;
  ulong uVar10;
  line *plVar11;
  bool bVar12;
  
  pmVar6 = curwp;
  pbVar5 = curbp;
  if (n < 0) {
    iVar9 = gotobop(f,-n);
    return iVar9;
  }
  iVar9 = 0;
LAB_001136b7:
  do {
    if (iVar9 == n) {
      bVar12 = curwp->w_dotp->l_fp == curbp->b_headp;
      if (bVar12) {
        gotoeol(8,1);
        curwp->w_rflag = curwp->w_rflag | 2;
      }
      else {
        curwp->w_rflag = curwp->w_rflag | 2;
      }
      return (uint)!bVar12;
    }
    iVar9 = iVar9 + 1;
    *i = iVar9;
    plVar2 = pbVar5->b_headp;
    bVar12 = false;
    plVar11 = pmVar6->w_dotp;
    while (plVar3 = plVar11->l_fp, plVar3 != plVar2) {
      pmVar6->w_doto = 0;
      uVar4 = plVar11->l_used;
      if (plVar11->l_used < 1) {
        uVar4 = 0;
      }
      uVar10 = 0;
      do {
        if (uVar4 == uVar10) {
          bVar7 = false;
          if (bVar12) goto LAB_001136b7;
          goto LAB_0011372b;
        }
        ppuVar8 = __ctype_b_loc();
        pbVar1 = (byte *)(plVar11->l_text + uVar10);
        uVar10 = uVar10 + 1;
      } while ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
      bVar7 = true;
LAB_0011372b:
      bVar12 = bVar7;
      pmVar6->w_dotp = plVar3;
      pmVar6->w_dotline = pmVar6->w_dotline + 1;
      plVar11 = plVar3;
    }
  } while( true );
}

Assistant:

int
do_gotoeop(int f, int n, int *i)
{
	int col, nospace, j = 0;

	/* the other way... */
	if (n < 0)
		return (gotobop(f, -n));

	/* for each one asked for */
	while (n-- > 0) {
		*i = ++j;
		nospace = 0;
		while (lforw(curwp->w_dotp) != curbp->b_headp) {
			col = 0;
			curwp->w_doto = 0;

			while (col < llength(curwp->w_dotp) &&
			    (isspace(lgetc(curwp->w_dotp, col))))
				col++;

			if (col >= llength(curwp->w_dotp)) {
				if (nospace)
					break;
			} else
				nospace = 1;

			curwp->w_dotp = lforw(curwp->w_dotp);
			curwp->w_dotline++;

		}
	}
	/* do not continue after end of buffer */
	if (lforw(curwp->w_dotp) == curbp->b_headp) {
		gotoeol(FFRAND, 1);
		curwp->w_rflag |= WFMOVE;
		return (FALSE);
	}

	/* force screen update */
	curwp->w_rflag |= WFMOVE;
	return (TRUE);
}